

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O2

int sqlite3_internal_bind_value(sqlite3_stmt *stmt,int idx,Value *value)

{
  pointer pPVar1;
  reference this;
  int iVar2;
  
  iVar2 = 0x15;
  if (((stmt != (sqlite3_stmt *)0x0) &&
      ((stmt->prepared).
       super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
       .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl !=
       (PreparedStatement *)0x0)) &&
     ((stmt->result).
      super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
      super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
      super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl == (QueryResult *)0x0)) {
    iVar2 = 0x19;
    if (0 < idx) {
      pPVar1 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->(&stmt->prepared);
      if (idx <= (int)(pPVar1->named_param_map)._M_h._M_element_count) {
        this = duckdb::vector<duckdb::Value,_true>::get<true>(&stmt->bound_values,(ulong)(idx - 1));
        duckdb::Value::operator=(this,value);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int sqlite3_internal_bind_value(sqlite3_stmt *stmt, int idx, Value value) {
	if (!stmt || !stmt->prepared || stmt->result) {
		return SQLITE_MISUSE;
	}
	if (idx < 1 || idx > (int)stmt->prepared->named_param_map.size()) {
		return SQLITE_RANGE;
	}
	stmt->bound_values[idx - 1] = value;
	return SQLITE_OK;
}